

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O0

int custom_send(tr_socket *socket,void *pdu,size_t len,time_t timeout)

{
  long lVar1;
  uint32_t uVar2;
  uint *puVar3;
  long in_FS_OFFSET;
  uint32_t *errlen;
  pdu_error *err;
  time_t timeout_local;
  size_t len_local;
  void *pdu_local;
  tr_socket *socket_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)((long)pdu + 1) == '\n') {
    puVar3 = (uint *)((long)pdu + (ulong)*(uint *)((long)pdu + 8) + 0xc);
    uVar2 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,*(uint32_t *)((long)pdu + 4));
    if (puVar3 < (uint *)((long)pdu + (ulong)uVar2)) {
      printf("err msg: %.*s\n",(ulong)*puVar3,puVar3 + 1);
    }
  }
  timeout_local._0_4_ = (int)len;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)timeout_local;
}

Assistant:

static int custom_send(const struct tr_socket *socket __attribute__((unused)), const void *pdu, const size_t len,
		       const time_t timeout __attribute__((unused)))
{
	const struct pdu_error *err = pdu;

	if (err->type == 10) {
		uint32_t *errlen = (uint32_t *)((char *)err->rest + err->len_enc_pdu);

		if ((char *)errlen < (char *)err + BYTES32(err->len))
			printf("err msg: %.*s\n", *errlen, (char *)(errlen + 1));
	}
	return len;
}